

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

void __thiscall Centaurus::CharClass<char>::CharClass(CharClass<char> *this,wchar_t ch)

{
  Range<char> local_28;
  wchar_t local_14;
  CharClass<char> *pCStack_10;
  wchar_t ch_local;
  CharClass<char> *this_local;
  
  this->_vptr_CharClass = (_func_int **)&PTR__CharClass_00255b88;
  local_14 = ch;
  pCStack_10 = this;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::vector
            (&this->m_ranges);
  Range<char>::make_from_wide(&local_28,local_14,local_14 + L'\x01');
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::push_back
            (&this->m_ranges,&local_28);
  Range<char>::~Range(&local_28);
  return;
}

Assistant:

CharClass(wchar_t ch)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(ch, ch + 1));
    }